

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O0

bool WriteBase(ON_SubDComponentBase *base,ON_BinaryArchive *archive)

{
  ON__UINT32 i;
  bool bVar1;
  ON__UINT8 c;
  uint i_00;
  uint uVar2;
  int iVar3;
  bool bVar4;
  bool bWriteSymmetrySetNext;
  bool bWriteGroupId;
  uchar deprecated_and_never_used_zero;
  uchar cP;
  bool bHaveP;
  double P [3];
  unsigned_short level;
  uint id;
  uint archive_id;
  ON_BinaryArchive *archive_local;
  ON_SubDComponentBase *base_local;
  
  i_00 = ON_SubDComponentBase::ArchiveId(base);
  i = base->m_id;
  uVar2 = ON_SubDComponentBase::SubdivisionLevel(base);
  P[2]._6_2_ = (ON__UINT16)uVar2;
  bVar1 = ON_BinaryArchive::WriteInt(archive,i_00);
  if (((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(archive,i), bVar1)) &&
     (bVar1 = ON_BinaryArchive::WriteShort(archive,P[2]._6_2_), bVar1)) {
    iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
    if (iVar3 < 0x46) {
      bVar1 = ON_SubDComponentBase::GetSavedSubdivisionPoint
                        (base,(double *)&stack0xffffffffffffffb8);
      c = '\0';
      if (bVar1) {
        c = '\x04';
      }
      bVar1 = ON_BinaryArchive::WriteChar(archive,c);
      if ((bVar1) &&
         (((c == '\0' ||
           (bVar1 = Internal_WriteDouble3((double *)&stack0xffffffffffffffb8,archive), bVar1)) &&
          (bVar1 = ON_BinaryArchive::WriteChar(archive,'\0'), bVar1)))) {
        return true;
      }
    }
    else {
      bVar1 = Internal_WriteComponentAdditionSize(false,archive,'\x18');
      if (bVar1) {
        bVar4 = base->m_group_id != 0;
        bVar1 = Internal_WriteComponentAdditionSize(bVar4,archive,'\x04');
        if ((bVar1) &&
           ((!bVar4 || (bVar1 = ON_BinaryArchive::WriteInt(archive,base->m_group_id), bVar1)))) {
          bVar1 = ON_SubDComponentBase::InSymmetrySet(base);
          bVar4 = Internal_WriteComponentAdditionSize(bVar1,archive,'\x05');
          if ((bVar4) && ((!bVar1 || (bVar1 = Internal_WritesSymmetrySetNext(base,archive), bVar1)))
             ) {
            bVar1 = Internal_FinishWritingComponentAdditions(archive);
            return bVar1;
          }
        }
      }
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

static bool WriteBase(
  const ON_SubDComponentBase* base,
  ON_BinaryArchive& archive
  )
{
  for (;;)
  {
    unsigned int archive_id = base->ArchiveId();
    unsigned int id = base->m_id;
    unsigned short level = (unsigned short)base->SubdivisionLevel();
    if (!archive.WriteInt(archive_id))
      break;
    if (!archive.WriteInt(id))
      break;
    if (!archive.WriteShort(level))
      break;

    if (archive.Archive3dmVersion() < 70)
    {
      // version 6 3dm files
      double P[3];
      const bool bHaveP = base->GetSavedSubdivisionPoint(P);

      unsigned char cP = bHaveP ? 4U : 0U;
      if (!archive.WriteChar(cP))
        break;
      if (0 != cP)
      {
        if (!Internal_WriteDouble3(P, archive))
          break;
      }

      unsigned char deprecated_and_never_used_zero = 0U;
      if (!archive.WriteChar(deprecated_and_never_used_zero))
        break;
      return true;
    }
    
    // version 7 3dm files and later

    // never used displacement
    if ( false == Internal_WriteComponentAdditionSize(false,archive,24) )
      break;

    // 4 byte group id addition
    const bool bWriteGroupId = base->m_group_id > 0;
    if (false == Internal_WriteComponentAdditionSize(bWriteGroupId, archive, 4))
      break;
    if (bWriteGroupId)
    {
      if (!archive.WriteInt(base->m_group_id))
        break;
    }

    // 5 byte symmetry set next addition Dec 2020 Rhino 7.2 and later
    // 5 bytes = unsigned archive id + char flags
    const bool bWriteSymmetrySetNext = base->InSymmetrySet();
    if (false == Internal_WriteComponentAdditionSize(bWriteSymmetrySetNext, archive, 5))
      break;
    if (bWriteSymmetrySetNext)
    {
      if (!Internal_WritesSymmetrySetNext(*base,archive))
        break;
    }

    return Internal_FinishWritingComponentAdditions(archive);
  }
  return ON_SUBD_RETURN_ERROR(false);
}